

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O1

list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
ZXing::Aztec::SimplifyStates
          (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
           *__return_storage_ptr__,
          list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *states)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  EncodingState *other;
  bool bVar3;
  bool bVar4;
  _Node *p_Var5;
  iterator __position;
  iterator iVar6;
  iterator __ret;
  bool bVar7;
  
  (__return_storage_ptr__->
  super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>).
  _M_impl._M_node._M_size = 0;
  p_Var2 = (states->
           super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var2 == (_List_node_base *)states) {
      return __return_storage_ptr__;
    }
    other = (EncodingState *)(p_Var2 + 1);
    bVar7 = true;
    __position._M_node =
         (__return_storage_ptr__->
         super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    do {
      if (__position._M_node == (_List_node_base *)__return_storage_ptr__) break;
      bVar3 = IsBetterThanOrEqualTo((EncodingState *)(__position._M_node + 1),other);
      if (bVar3) {
        bVar7 = false;
        iVar6._M_node = __position._M_node;
      }
      else {
        bVar4 = IsBetterThanOrEqualTo(other,(EncodingState *)(__position._M_node + 1));
        iVar6._M_node = (__position._M_node)->_M_next;
        if (bVar4) {
          std::__cxx11::
          list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::_M_erase
                    (__return_storage_ptr__,__position);
        }
      }
      __position._M_node = iVar6._M_node;
    } while (!bVar3);
    if (bVar7) {
      p_Var5 = std::__cxx11::
               list<ZXing::Aztec::EncodingState,std::allocator<ZXing::Aztec::EncodingState>>::
               _M_create_node<ZXing::Aztec::EncodingState_const&>
                         ((list<ZXing::Aztec::EncodingState,std::allocator<ZXing::Aztec::EncodingState>>
                           *)__return_storage_ptr__,other);
      std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
      psVar1 = &(__return_storage_ptr__->
                super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var2 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

static std::list<EncodingState> SimplifyStates(const std::list<EncodingState>& states)
{
	std::list<EncodingState> result;
	for (auto& newState : states) {
		bool add = true;
		for (auto iterator = result.begin(); iterator != result.end();) {
			auto& oldState = *iterator;
			if (IsBetterThanOrEqualTo(oldState, newState)) {
				add = false;
				break;
			}
			if (IsBetterThanOrEqualTo(newState, oldState)) {
				iterator = result.erase(iterator);
			}
			else {
				++iterator;
			}
		}
		if (add) {
			result.push_back(newState);
		}
	}
	return result;
}